

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O2

HighsInt create(HighsIndexCollection *index_collection,HighsInt num_set_entries,HighsInt *set,
               HighsInt dimension)

{
  bool bVar1;
  HighsInt HVar2;
  ulong uVar3;
  allocator_type local_49;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  if (num_set_entries < 0) {
    return 1;
  }
  if (dimension < 0) {
    HVar2 = 2;
  }
  else {
    index_collection->dimension_ = dimension;
    index_collection->is_set_ = true;
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_48,set,set + (uint)num_set_entries,
               &local_49);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&index_collection->set_,&local_48);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
    index_collection->set_num_entries_ = num_set_entries;
    bVar1 = increasingSetOk(&index_collection->set_,1,0,true);
    if (bVar1) {
      HVar2 = 0;
      for (uVar3 = 0; (uint)num_set_entries != uVar3; uVar3 = uVar3 + 1) {
        if ((uint)dimension <= (uint)set[uVar3]) {
          return ~(uint)uVar3;
        }
      }
    }
    else {
      HVar2 = 3;
    }
  }
  return HVar2;
}

Assistant:

HighsInt create(HighsIndexCollection& index_collection,
                const HighsInt num_set_entries, const HighsInt* set,
                const HighsInt dimension) {
  // Create an index collection for the given set - so long as it is strictly
  // ordered
  if (num_set_entries < 0) return kIndexCollectionCreateIllegalSetSize;
  if (dimension < 0) return kIndexCollectionCreateIllegalSetDimension;
  index_collection.dimension_ = dimension;
  index_collection.is_set_ = true;
  index_collection.set_ = {set, set + num_set_entries};
  index_collection.set_num_entries_ = num_set_entries;
  if (!increasingSetOk(index_collection.set_, 1, 0, true))
    return kIndexCollectionCreateIllegalSetOrder;
  for (HighsInt ix = 0; ix < num_set_entries; ix++)
    if (set[ix] < 0 || set[ix] >= dimension) return -(ix + 1);
  return kIndexCollectionCreateOk;
}